

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrend1.c
# Opt level: O0

FT_Error ft_raster1_render(FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Render_Mode mode,
                          FT_Vector *origin)

{
  FT_Memory memory_00;
  FT_Bool FVar1;
  FT_Outline *outline_00;
  FT_Bitmap *pFVar2;
  uchar *puVar3;
  FT_Bitmap *local_c0;
  FT_Raster_Params params;
  FT_Pos y_shift;
  FT_Pos x_shift;
  FT_Memory memory;
  FT_Bitmap *bitmap;
  FT_Outline *outline;
  FT_Vector *pFStack_30;
  FT_Error error;
  FT_Vector *origin_local;
  FT_GlyphSlot pFStack_20;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict render_local;
  
  outline._4_4_ = 0;
  outline_00 = &slot->outline;
  pFVar2 = &slot->bitmap;
  memory_00 = (render->root).memory;
  y_shift = 0;
  params.clip_box.yMax = 0;
  pFStack_30 = origin;
  origin_local._4_4_ = mode;
  pFStack_20 = slot;
  slot_local = (FT_GlyphSlot)render;
  if (slot->format == render->glyph_format) {
    if (mode != FT_RENDER_MODE_MONO) {
      return 0x13;
    }
    if ((slot->internal->flags & 1) != 0) {
      ft_mem_free(memory_00,(slot->bitmap).buffer);
      (slot->bitmap).buffer = (uchar *)0x0;
      pFStack_20->internal->flags = pFStack_20->internal->flags & 0xfffffffe;
    }
    FVar1 = ft_glyphslot_preset_bitmap(pFStack_20,origin_local._4_4_,pFStack_30);
    if (FVar1 == '\0') {
      puVar3 = (uchar *)ft_mem_realloc(memory_00,(long)(slot->bitmap).pitch,0,(ulong)pFVar2->rows,
                                       (void *)0x0,(FT_Error *)((long)&outline + 4));
      (slot->bitmap).buffer = puVar3;
      if (outline._4_4_ == 0) {
        pFStack_20->internal->flags = pFStack_20->internal->flags | 1;
        y_shift = (FT_Pos)(pFStack_20->bitmap_left * -0x40);
        params.clip_box.yMax = (FT_Pos)(int)((pFVar2->rows - pFStack_20->bitmap_top) * 0x40);
        if (pFStack_30 != (FT_Vector *)0x0) {
          y_shift = pFStack_30->x + y_shift;
          params.clip_box.yMax = pFStack_30->y + params.clip_box.yMax;
        }
        if ((y_shift != 0) || (params.clip_box.yMax != 0)) {
          FT_Outline_Translate(outline_00,y_shift,params.clip_box.yMax);
        }
        params.source._0_4_ = 0;
        local_c0 = pFVar2;
        params.target = (FT_Bitmap *)outline_00;
        outline._4_4_ =
             (*(code *)slot_local->linearHoriAdvance)((slot_local->metrics).vertAdvance,&local_c0);
      }
    }
    else {
      outline._4_4_ = 0x62;
    }
  }
  else {
    outline._4_4_ = 6;
  }
  if (outline._4_4_ == 0) {
    pFStack_20->format = FT_GLYPH_FORMAT_BITMAP;
  }
  else if ((pFStack_20->internal->flags & 1) != 0) {
    ft_mem_free(memory_00,(slot->bitmap).buffer);
    (slot->bitmap).buffer = (uchar *)0x0;
    pFStack_20->internal->flags = pFStack_20->internal->flags & 0xfffffffe;
  }
  if ((y_shift != 0) || (params.clip_box.yMax != 0)) {
    FT_Outline_Translate(outline_00,-y_shift,-params.clip_box.yMax);
  }
  return outline._4_4_;
}

Assistant:

static FT_Error
  ft_raster1_render( FT_Renderer       render,
                     FT_GlyphSlot      slot,
                     FT_Render_Mode    mode,
                     const FT_Vector*  origin )
  {
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  outline = &slot->outline;
    FT_Bitmap*   bitmap  = &slot->bitmap;
    FT_Memory    memory  = render->root.memory;
    FT_Pos       x_shift = 0;
    FT_Pos       y_shift = 0;

    FT_Raster_Params  params;


    /* check glyph image format */
    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* check rendering mode */
    if ( mode != FT_RENDER_MODE_MONO )
    {
      /* raster1 is only capable of producing monochrome bitmaps */
      return FT_THROW( Cannot_Render_Glyph );
    }

    /* release old bitmap buffer */
    if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( ft_glyphslot_preset_bitmap( slot, mode, origin ) )
    {
      error = FT_THROW( Raster_Overflow );
      goto Exit;
    }

    /* allocate new one */
    if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, bitmap->pitch ) )
      goto Exit;

    slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    x_shift = -slot->bitmap_left * 64;
    y_shift = ( (FT_Int)bitmap->rows - slot->bitmap_top ) * 64;

    if ( origin )
    {
      x_shift += origin->x;
      y_shift += origin->y;
    }

    /* translate outline to render it into the bitmap */
    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, x_shift, y_shift );

    /* set up parameters */
    params.target = bitmap;
    params.source = outline;
    params.flags  = FT_RASTER_FLAG_DEFAULT;

    /* render outline into the bitmap */
    error = render->raster_render( render->raster, &params );

  Exit:
    if ( !error )
      /* everything is fine; the glyph is now officially a bitmap */
      slot->format = FT_GLYPH_FORMAT_BITMAP;
    else if ( slot->internal->flags & FT_GLYPH_OWN_BITMAP )
    {
      FT_FREE( bitmap->buffer );
      slot->internal->flags &= ~FT_GLYPH_OWN_BITMAP;
    }

    if ( x_shift || y_shift )
      FT_Outline_Translate( outline, -x_shift, -y_shift );

    return error;
  }